

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O2

string_t duckdb::HandleVectorCastError::Operation<duckdb::string_t>
                   (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  anon_union_16_2_67f50693_for_value aVar1;
  
  HandleCastError::AssignError(error_message,cast_data->parameters);
  cast_data->all_converted = false;
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
  aVar1.pointer = (anon_struct_16_3_d7536bce_for_pointer)NullValue<duckdb::string_t>();
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}